

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.h
# Opt level: O2

int bandit::run(int argc,char **argv,choice_options *choices,bool allow_further)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  unique_ptr<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>_>
  this;
  spec_registry *specs;
  controller_t *controller_00;
  undefined7 in_register_00000009;
  vector<bandit::run_policy::filter_chain_element,_std::allocator<bandit::run_policy::filter_chain_element>_>
  vStack_158;
  options opt;
  controller_t controller;
  
  detail::options::options(&opt,argc,argv,choices);
  if (((int)CONCAT71(in_register_00000009,allow_further) == 0) &&
     ((opt.has_further_arguments_ != false || (opt.has_unknown_options_ == true)))) {
    detail::options::print_usage(&opt);
    iVar3 = 1;
  }
  else {
    detail::controller_t::controller_t(&controller);
    bVar2 = detail::options::update_controller_settings(&opt,&controller);
    if (bVar2) {
      this._M_t.
      super___uniq_ptr_impl<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>_>
      ._M_t.
      super__Tuple_impl<0UL,_bandit::run_policy::interface_*,_std::default_delete<bandit::run_policy::interface>_>
      .super__Head_base<0UL,_bandit::run_policy::interface_*,_false>._M_head_impl =
           (__uniq_ptr_data<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>,_true,_true>
            )operator_new(0x30);
      std::
      vector<bandit::run_policy::filter_chain_element,_std::allocator<bandit::run_policy::filter_chain_element>_>
      ::vector(&vStack_158,&opt.filter_chain_);
      run_policy::bandit::bandit
                ((bandit *)
                 this._M_t.
                 super___uniq_ptr_impl<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_bandit::run_policy::interface_*,_std::default_delete<bandit::run_policy::interface>_>
                 .super__Head_base<0UL,_bandit::run_policy::interface_*,_false>._M_head_impl,
                 &vStack_158,
                 opt.options_.super__Vector_base<option::Option,_std::allocator<option::Option>_>.
                 _M_impl.super__Vector_impl_data._M_start[8].desc != (Descriptor *)0x0,
                 opt.options_.super__Vector_base<option::Option,_std::allocator<option::Option>_>.
                 _M_impl.super__Vector_impl_data._M_start[9].desc != (Descriptor *)0x0);
      if ((__uniq_ptr_impl<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>_>
           )controller.run_policy._M_t.
            super___uniq_ptr_impl<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>_>
            ._M_t.
            super__Tuple_impl<0UL,_bandit::run_policy::interface_*,_std::default_delete<bandit::run_policy::interface>_>
            .super__Head_base<0UL,_bandit::run_policy::interface_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>_>
           )0x0) {
        lVar1 = *(long *)controller.run_policy._M_t.
                         super___uniq_ptr_impl<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_bandit::run_policy::interface_*,_std::default_delete<bandit::run_policy::interface>_>
                         .super__Head_base<0UL,_bandit::run_policy::interface_*,_false>._M_head_impl
        ;
        controller.run_policy._M_t.
        super___uniq_ptr_impl<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>_>
        ._M_t.
        super__Tuple_impl<0UL,_bandit::run_policy::interface_*,_std::default_delete<bandit::run_policy::interface>_>
        .super__Head_base<0UL,_bandit::run_policy::interface_*,_false>._M_head_impl =
             this._M_t.
             super___uniq_ptr_impl<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>_>
             ._M_t.
             super__Tuple_impl<0UL,_bandit::run_policy::interface_*,_std::default_delete<bandit::run_policy::interface>_>
             .super__Head_base<0UL,_bandit::run_policy::interface_*,_false>._M_head_impl;
        (**(code **)(lVar1 + 8))();
        this._M_t.
        super___uniq_ptr_impl<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>_>
        ._M_t.
        super__Tuple_impl<0UL,_bandit::run_policy::interface_*,_std::default_delete<bandit::run_policy::interface>_>
        .super__Head_base<0UL,_bandit::run_policy::interface_*,_false>._M_head_impl =
             controller.run_policy._M_t.
             super___uniq_ptr_impl<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>_>
             ._M_t.
             super__Tuple_impl<0UL,_bandit::run_policy::interface_*,_std::default_delete<bandit::run_policy::interface>_>
             .super__Head_base<0UL,_bandit::run_policy::interface_*,_false>._M_head_impl;
      }
      controller.run_policy._M_t.
      super___uniq_ptr_impl<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>_>
      ._M_t.
      super__Tuple_impl<0UL,_bandit::run_policy::interface_*,_std::default_delete<bandit::run_policy::interface>_>
      .super__Head_base<0UL,_bandit::run_policy::interface_*,_false>._M_head_impl =
           this._M_t.
           super___uniq_ptr_impl<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>_>
           ._M_t.
           super__Tuple_impl<0UL,_bandit::run_policy::interface_*,_std::default_delete<bandit::run_policy::interface>_>
           .super__Head_base<0UL,_bandit::run_policy::interface_*,_false>._M_head_impl;
      std::
      vector<bandit::run_policy::filter_chain_element,_std::allocator<bandit::run_policy::filter_chain_element>_>
      ::~vector(&vStack_158);
      detail::controller_t::get_controller_address()::controller_ = &controller;
      specs = detail::specs_abi_cxx11_();
      controller_00 = detail::controller_t::registered_controller();
      iVar3 = run(&opt,specs,controller_00);
    }
    else {
      iVar3 = 1;
    }
    detail::controller_t::~controller_t(&controller);
  }
  detail::options::~options(&opt);
  return iVar3;
}

Assistant:

inline int run(int argc, char* argv[], const detail::choice_options& choices, bool allow_further = true) {
    detail::options opt(argc, argv, choices);

    if (!allow_further &&
        (opt.has_further_arguments() || opt.has_unknown_options())) {
      opt.print_usage();
      return 1;
    }

    detail::controller_t controller;
    if (!opt.update_controller_settings(controller)) {
      return 1;
    }

    controller.set_policy(new run_policy::bandit(opt.filter_chain(), opt.break_on_failure(), opt.dry_run()));

    detail::register_controller(&controller);
    return run(opt, detail::specs());
  }